

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.h
# Opt level: O0

void __thiscall lf::io::VtkFile::ScalarData<double>::ScalarData(ScalarData<double> *this)

{
  allocator<char> local_11;
  ScalarData<double> *local_10;
  ScalarData<double> *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::vector<double,_std::allocator<double>_>::vector(&this->data);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->lookup_table,"default",&local_11);
  std::allocator<char>::~allocator(&local_11);
  return;
}

Assistant:

ScalarData() = default;